

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_f3d98::MMIFStream::MMIFStream(MMIFStream *this,char *fileName)

{
  int iVar1;
  IoExc *pIVar2;
  void *pvVar3;
  char *in_RSI;
  IStream *in_RDI;
  stat s;
  stat local_b0;
  char *local_10;
  
  local_10 = in_RSI;
  Imf_3_4::IStream::IStream(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__MMIFStream_0025e870;
  *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x30) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  iVar1 = open(local_10,0);
  *(int *)(in_RDI + 0x28) = iVar1;
  if (*(int *)(in_RDI + 0x28) == -1) {
    pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc(pIVar2,"Cannot open file.");
    __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
  }
  memset(&local_b0,0,0x90);
  iVar1 = stat(local_10,&local_b0);
  if (iVar1 != 0) {
    pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc(pIVar2,"Cannot stat file.");
    __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
  }
  *(__off_t *)(in_RDI + 0x48) = local_b0.st_size;
  pvVar3 = mmap((void *)0x0,*(size_t *)(in_RDI + 0x48),1,1,*(int *)(in_RDI + 0x28),0);
  *(void **)(in_RDI + 0x30) = pvVar3;
  if (*(long *)(in_RDI + 0x30) == -1) {
    pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc(pIVar2,"Cannot memory map file.");
    __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
  }
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RDI + 0x30);
  return;
}

Assistant:

MMIFStream::MMIFStream (const char fileName[])
    : OPENEXR_IMF_NAMESPACE::IStream (fileName)
#ifdef _WIN32
    , _f (INVALID_HANDLE_VALUE)
#else
    , _f (-1)
#endif
    , _mmap (reinterpret_cast<void*> (-1))
    , _mmapStart (nullptr)
    , _pos (0)
    , _length (0)
{
#ifdef _WIN32
    const std::wstring fileNameWide = WidenFilename (fileName);
    try
    {
        _f = CreateFileW (
            fileNameWide.c_str (),
            GENERIC_READ,
            FILE_SHARE_READ,
            0,
            OPEN_EXISTING,
            FILE_ATTRIBUTE_NORMAL,
            0);
    }
    catch (const std::exception&)
    {
        _f = INVALID_HANDLE_VALUE;
    }
    if (INVALID_HANDLE_VALUE == _f)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot open file.");
    }

    struct _stati64 s;
    memset (&s, 0, sizeof (struct _stati64));
    if (_wstati64 (fileNameWide.c_str (), &s) != 0)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot stat file.");
    }

    _length = s.st_size;

    _mmap = CreateFileMapping (_f, 0, PAGE_READONLY, 0, 0, 0);
    if (!_mmap) { throw IEX_NAMESPACE::IoExc ("Cannot memory map file."); }

    _mmapStart = reinterpret_cast<const char*> (
        MapViewOfFile (_mmap, FILE_MAP_READ, 0, 0, 0));
    if (!_mmapStart)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot map view of file.");
    }

#else

    _f = open (fileName, O_RDONLY);
    if (-1 == _f) { throw IEX_NAMESPACE::IoExc ("Cannot open file."); }

    struct stat s;
    memset (&s, 0, sizeof (struct stat));
    if (stat (fileName, &s) != 0)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot stat file.");
    }

    _length = s.st_size;

    _mmap = mmap (0, _length, PROT_READ, MAP_SHARED, _f, 0);
    if (_mmap == (void*) -1)
    {
        throw IEX_NAMESPACE::IoExc ("Cannot memory map file.");
    }

    _mmapStart = reinterpret_cast<char*> (_mmap);
#endif
}